

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O2

void meshopt_optimizeVertexCacheFifo
               (uint *destination,uint *indices,size_t index_count,size_t vertex_count,
               uint cache_size)

{
  void **ppvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint *puVar8;
  uint uVar9;
  uint *indices_00;
  uint *__dest;
  uint *__s;
  uint *puVar10;
  void *__s_00;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ulong uStack_190;
  uint local_17c;
  TriangleAdjacency adjacency;
  meshopt_Allocator allocator;
  
  memset(&allocator,0,200);
  if (vertex_count == 0 || index_count == 0) {
LAB_00169951:
    meshopt_Allocator::~meshopt_Allocator(&allocator);
    return;
  }
  indices_00 = indices;
  if (destination == indices) {
    indices_00 = meshopt_Allocator::allocate<unsigned_int>(&allocator,index_count);
    memcpy(indices_00,indices,index_count * 4);
  }
  adjacency.counts = (uint *)0x0;
  adjacency.offsets = (uint *)0x0;
  adjacency.data = (uint *)0x0;
  meshopt::buildTriangleAdjacency(&adjacency,indices_00,index_count,vertex_count,&allocator);
  __dest = meshopt_Allocator::allocate<unsigned_int>(&allocator,vertex_count);
  puVar8 = adjacency.counts;
  memcpy(__dest,adjacency.counts,vertex_count * 4);
  __s = meshopt_Allocator::allocate<unsigned_int>(&allocator,vertex_count);
  memset(__s,0,vertex_count * 4);
  puVar10 = meshopt_Allocator::allocate<unsigned_int>(&allocator,index_count);
  __s_00 = (*meshopt_Allocator::StorageT<void>::allocate)(index_count / 3);
  ppvVar1 = allocator.blocks + allocator.count;
  allocator.count = allocator.count + 1;
  *ppvVar1 = __s_00;
  memset(__s_00,0,index_count / 3);
  uVar9 = cache_size + 1;
  local_17c = 1;
  iVar11 = 0;
  uStack_190 = 0;
LAB_00169abe:
  uVar17 = 0;
  while ((int)uStack_190 != -1) {
    uVar18 = (ulong)uVar17;
    uVar2 = adjacency.offsets[uStack_190 & 0xffffffff];
    uVar3 = puVar8[uStack_190 & 0xffffffff];
    for (lVar16 = 0; uVar12 = (ulong)uVar17, (ulong)uVar3 << 2 != lVar16; lVar16 = lVar16 + 4) {
      uVar4 = *(uint *)((long)adjacency.data + lVar16 + (ulong)uVar2 * 4);
      uVar13 = (ulong)uVar4;
      if (*(char *)((long)__s_00 + uVar13) == '\0') {
        uVar5 = indices_00[uVar4 * 3];
        uVar4 = indices_00[uVar4 * 3 + 1];
        uVar6 = indices_00[uVar13 * 3 + 2 & 0xffffffff];
        destination[(uint)(iVar11 * 3)] = uVar5;
        destination[iVar11 * 3 + 1] = uVar4;
        destination[iVar11 * 3 + 2] = uVar6;
        puVar10[uVar12] = uVar5;
        puVar10[uVar17 + 1] = uVar4;
        puVar10[uVar17 + 2] = uVar6;
        __dest[uVar5] = __dest[uVar5] - 1;
        __dest[uVar4] = __dest[uVar4] - 1;
        __dest[uVar6] = __dest[uVar6] - 1;
        if (cache_size < uVar9 - __s[uVar5]) {
          __s[uVar5] = uVar9;
          uVar9 = uVar9 + 1;
        }
        if (cache_size < uVar9 - __s[uVar4]) {
          __s[uVar4] = uVar9;
          uVar9 = uVar9 + 1;
        }
        if (cache_size < uVar9 - __s[uVar6]) {
          __s[uVar6] = uVar9;
          uVar9 = uVar9 + 1;
        }
        iVar11 = iVar11 + 1;
        uVar17 = uVar17 + 3;
        *(undefined1 *)((long)__s_00 + uVar13) = 1;
      }
    }
    uStack_190 = 0xffffffffffffffff;
    iVar14 = -1;
    for (lVar16 = uVar18 << 2; uVar12 * 4 - lVar16 != 0; lVar16 = lVar16 + 4) {
      uVar18 = (ulong)*(uint *)((long)puVar10 + lVar16);
      if (__dest[uVar18] != 0) {
        iVar19 = uVar9 - __s[uVar18];
        if (cache_size < (uVar9 + __dest[uVar18] * 2) - __s[uVar18]) {
          iVar19 = 0;
        }
        iVar15 = iVar14;
        if (iVar14 < iVar19) {
          iVar15 = iVar19;
        }
        bVar7 = iVar14 < iVar19;
        uStack_190 = uStack_190 & 0xffffffff;
        iVar14 = iVar15;
        if (bVar7) {
          uStack_190 = uVar18;
        }
      }
    }
    if ((int)uStack_190 == -1) {
      do {
        uVar12 = uVar12 - 1;
        if (uVar12 == 0xffffffffffffffff) goto LAB_00169c8d;
        uStack_190 = (ulong)puVar10[uVar12 & 0xffffffff];
        uVar17 = uVar17 - 1;
      } while (__dest[uStack_190] == 0);
    }
  }
  goto LAB_00169951;
LAB_00169c8d:
  if (vertex_count <= local_17c) goto LAB_00169ca1;
  if (__dest[local_17c] != 0) {
    uStack_190 = (ulong)local_17c;
    goto LAB_00169abe;
  }
  local_17c = local_17c + 1;
  goto LAB_00169c8d;
LAB_00169ca1:
  uStack_190 = 0xffffffffffffffff;
  goto LAB_00169abe;
}

Assistant:

void meshopt_optimizeVertexCacheFifo(unsigned int* destination, const unsigned int* indices, size_t index_count, size_t vertex_count, unsigned int cache_size)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(cache_size >= 3);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	size_t face_count = index_count / 3;

	// build adjacency information
	TriangleAdjacency adjacency = {};
	buildTriangleAdjacency(adjacency, indices, index_count, vertex_count, allocator);

	// live triangle counts
	unsigned int* live_triangles = allocator.allocate<unsigned int>(vertex_count);
	memcpy(live_triangles, adjacency.counts, vertex_count * sizeof(unsigned int));

	// cache time stamps
	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);
	memset(cache_timestamps, 0, vertex_count * sizeof(unsigned int));

	// dead-end stack
	unsigned int* dead_end = allocator.allocate<unsigned int>(index_count);
	unsigned int dead_end_top = 0;

	// emitted flags
	unsigned char* emitted_flags = allocator.allocate<unsigned char>(face_count);
	memset(emitted_flags, 0, face_count);

	unsigned int current_vertex = 0;

	unsigned int timestamp = cache_size + 1;
	unsigned int input_cursor = 1; // vertex to restart from in case of dead-end

	unsigned int output_triangle = 0;

	while (current_vertex != ~0u)
	{
		const unsigned int* next_candidates_begin = &dead_end[0] + dead_end_top;

		// emit all vertex neighbours
		const unsigned int* neighbours_begin = &adjacency.data[0] + adjacency.offsets[current_vertex];
		const unsigned int* neighbours_end = neighbours_begin + adjacency.counts[current_vertex];

		for (const unsigned int* it = neighbours_begin; it != neighbours_end; ++it)
		{
			unsigned int triangle = *it;

			if (!emitted_flags[triangle])
			{
				unsigned int a = indices[triangle * 3 + 0], b = indices[triangle * 3 + 1], c = indices[triangle * 3 + 2];

				// output indices
				destination[output_triangle * 3 + 0] = a;
				destination[output_triangle * 3 + 1] = b;
				destination[output_triangle * 3 + 2] = c;
				output_triangle++;

				// update dead-end stack
				dead_end[dead_end_top + 0] = a;
				dead_end[dead_end_top + 1] = b;
				dead_end[dead_end_top + 2] = c;
				dead_end_top += 3;

				// update live triangle counts
				live_triangles[a]--;
				live_triangles[b]--;
				live_triangles[c]--;

				// update cache info
				// if vertex is not in cache, put it in cache
				if (timestamp - cache_timestamps[a] > cache_size)
					cache_timestamps[a] = timestamp++;

				if (timestamp - cache_timestamps[b] > cache_size)
					cache_timestamps[b] = timestamp++;

				if (timestamp - cache_timestamps[c] > cache_size)
					cache_timestamps[c] = timestamp++;

				// update emitted flags
				emitted_flags[triangle] = true;
			}
		}

		// next candidates are the ones we pushed to dead-end stack just now
		const unsigned int* next_candidates_end = &dead_end[0] + dead_end_top;

		// get next vertex
		current_vertex = getNextVertexNeighbour(next_candidates_begin, next_candidates_end, &live_triangles[0], &cache_timestamps[0], timestamp, cache_size);

		if (current_vertex == ~0u)
		{
			current_vertex = getNextVertexDeadEnd(&dead_end[0], dead_end_top, input_cursor, &live_triangles[0], vertex_count);
		}
	}

	assert(output_triangle == face_count);
}